

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O2

string * __thiscall
Dashel::DashelException::sourceToString_abi_cxx11_
          (string *__return_storage_ptr__,DashelException *this,Source s)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((uint)this < 9) {
    __s = &DAT_0011ed7c + *(int *)(&DAT_0011ed7c + ((ulong)this & 0xffffffff) * 4);
    __a = &local_a;
  }
  else {
    __s = "Unknown cause";
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

string DashelException::sourceToString(Source s)
	{
		// clang-format off
		const char* const sourceNames[] =
		{
			"Unknown cause",
			"Synchronisation error",
			"Invalid target",
			"Invalid operation",
			"Connection lost",
			"I/O error",
			"Connection failed",
			"Enumeration error",
			"Previous incoming data not read"
		};
		// clang-format on
		const size_t arrayLength(sizeof(sourceNames) / sizeof(const char*));
		if (s >= arrayLength)
			return sourceNames[0];
		else
			return sourceNames[s];
	}